

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.cpp
# Opt level: O0

void Kumu::hexdump(byte_t *buf,ui32_t dump_len,FILE *stream)

{
  int iVar1;
  byte *pbVar2;
  uint local_48;
  byte *local_40;
  byte_t *pp;
  ui32_t i;
  ui32_t line;
  byte_t *end_p;
  byte_t *p;
  FILE *stream_local;
  ui32_t dump_len_local;
  byte_t *buf_local;
  
  if (buf != (byte_t *)0x0) {
    p = (byte_t *)stream;
    if (stream == (FILE *)0x0) {
      p = _stderr;
    }
    pbVar2 = buf + dump_len;
    pp._4_4_ = 0;
    for (end_p = buf; end_p < pbVar2; end_p = end_p + hexdump::row_len) {
      fprintf((FILE *)p,"  %06x: ",(ulong)pp._4_4_);
      local_40 = end_p;
      for (pp._0_4_ = 0; (uint)pp < hexdump::row_len && local_40 < pbVar2; pp._0_4_ = (uint)pp + 1)
      {
        fprintf((FILE *)p,"%02x ",(ulong)*local_40);
        local_40 = local_40 + 1;
      }
      while ((uint)pp < hexdump::row_len) {
        fputs("   ",(FILE *)p);
        pp._0_4_ = (uint)pp + 1;
      }
      local_40 = end_p;
      for (pp._0_4_ = 0; (uint)pp < hexdump::row_len && local_40 < pbVar2; pp._0_4_ = (uint)pp + 1)
      {
        iVar1 = isprint((uint)*local_40);
        if (iVar1 == 0) {
          local_48 = 0x2e;
        }
        else {
          local_48 = (uint)*local_40;
        }
        fputc(local_48,(FILE *)p);
        local_40 = local_40 + 1;
      }
      fputc(10,(FILE *)p);
      pp._4_4_ = pp._4_4_ + 1;
    }
  }
  return;
}

Assistant:

void
Kumu::hexdump(const byte_t* buf, ui32_t dump_len, FILE* stream)
{
  if ( buf == 0 )
    return;

  if ( stream == 0 )
    stream = stderr;

  static ui32_t row_len = 16;
  const byte_t* p = buf;
  const byte_t* end_p = p + dump_len;

  for ( ui32_t line = 0; p < end_p; line++ )
    {
      fprintf(stream, "  %06x: ", line);
      ui32_t i;
      const byte_t* pp;

      for ( pp = p, i = 0; i < row_len && pp < end_p; i++, pp++ )
	fprintf(stream, "%02x ", *pp);

      while ( i++ < row_len )
	fputs("   ", stream);

      for ( pp = p, i = 0; i < row_len && pp < end_p; i++, pp++ )
	fputc((isprint(*pp) ? *pp : '.'), stream);

      fputc('\n', stream);
      p += row_len;
    }
}